

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::
GenerateSerializedSizeCode(RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,
                     "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += com.google.protobuf.CodedOutputStream\n    .computeEnumSizeNoTag($name$_.getInt(i));\n}\n"
                    );
  io::Printer::Print(printer,"size += dataSize;\n");
  text = "size += $tag_size$ * $name$_.size();\n";
  if (*(char *)(*(long *)(this->descriptor_ + 0x80) + 0x6c) != '\0') {
    text = 
    "if (!get$capitalized_name$List().isEmpty()) {  size += $tag_size$;\n  size += com.google.protobuf.CodedOutputStream\n    .computeUInt32SizeNoTag(dataSize);\n}"
    ;
  }
  io::Printer::Print(printer,variables,text);
  if (*(char *)(*(long *)(this->descriptor_ + 0x80) + 0x6c) == '\x01') {
    io::Printer::Print(printer,variables,"$name$MemoizedSerializedSize = dataSize;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  printer->Print(variables_,
    "for (int i = 0; i < $name$_.size(); i++) {\n"
    "  dataSize += com.google.protobuf.CodedOutputStream\n"
    "    .computeEnumSizeNoTag($name$_.getInt(i));\n"
    "}\n");
  printer->Print(
    "size += dataSize;\n");
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "    .computeUInt32SizeNoTag(dataSize);\n"
      "}");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * $name$_.size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}